

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

TestCaseGroup * vkt::compute::createBasicComputeShaderTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  BufferToBufferInvertTest *pBVar2;
  InvertSSBOInPlaceTest *pIVar3;
  WriteToMultipleSSBOTest *pWVar4;
  SSBOLocalBarrierTest *pSVar5;
  SSBOBarrierTest *pSVar6;
  SharedVarTest *pSVar7;
  SharedVarAtomicOpTest *pSVar8;
  CopyImageToSSBOTest *pCVar9;
  CopySSBOToImageTest *pCVar10;
  ImageAtomicOpTest *pIVar11;
  ImageBarrierTest *pIVar12;
  int iVar13;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  IVec3 local_58;
  IVec3 local_4c;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> basicComputeTests;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"basic","Basic compute tests");
  basicComputeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = pTVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"empty_shader",(allocator<char> *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Shader that does nothing",(allocator<char> *)&local_4c);
  addFunctionCaseWithPrograms
            (pTVar1,&local_78,&local_98,anon_unknown_0::EmptyShaderTest::createProgram,
             anon_unknown_0::EmptyShaderTest::createTest);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ubo_to_ssbo_single_invocation",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Copy from UBO to SSBO, inverting bits",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  iVar13 = 1;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,&local_78,&local_98,0x100,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ubo_to_ssbo_single_group",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Copy from UBO to SSBO, inverting bits",&local_99);
  local_58.m_data[0] = 2;
  local_58.m_data[1] = 1;
  local_58.m_data[2] = 4;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_4c.m_data[2] = 1;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,&local_78,&local_98,0x400,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ubo_to_ssbo_multiple_invocations",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Copy from UBO to SSBO, inverting bits",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 2;
  local_4c.m_data[1] = 4;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,&local_78,&local_98,0x400,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ubo_to_ssbo_multiple_groups",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Copy from UBO to SSBO, inverting bits",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 2;
  local_4c.m_data._0_8_ = &DAT_200000002;
  local_4c.m_data[2] = 4;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::UBOToSSBOInvertCase
                     (testCtx,&local_78,&local_98,0x400,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"copy_ssbo_single_invocation",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Copy between SSBOs, inverting bits",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     (testCtx,&local_78,&local_98,0x100,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"copy_ssbo_multiple_invocations",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Copy between SSBOs, inverting bits",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 2;
  local_4c.m_data[1] = 4;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     (testCtx,&local_78,&local_98,0x400,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"copy_ssbo_multiple_groups",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Copy between SSBOs, inverting bits",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 2;
  local_4c.m_data._0_8_ = &DAT_200000002;
  local_4c.m_data[2] = 4;
  pBVar2 = anon_unknown_0::BufferToBufferInvertTest::CopyInvertSSBOCase
                     (testCtx,&local_78,&local_98,0x400,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pBVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pIVar3 = (InvertSSBOInPlaceTest *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ssbo_rw_single_invocation",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Read and write same SSBO",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  anon_unknown_0::InvertSSBOInPlaceTest::InvertSSBOInPlaceTest
            (pIVar3,testCtx,&local_78,&local_98,0x100,true,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pIVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pIVar3 = (InvertSSBOInPlaceTest *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ssbo_rw_multiple_groups",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Read and write same SSBO",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 2;
  local_4c.m_data._0_8_ = &DAT_200000002;
  local_4c.m_data[2] = 4;
  iVar13 = 1;
  anon_unknown_0::InvertSSBOInPlaceTest::InvertSSBOInPlaceTest
            (pIVar3,testCtx,&local_78,&local_98,0x400,true,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pIVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pIVar3 = (InvertSSBOInPlaceTest *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ssbo_unsized_arr_single_invocation",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Read and write same SSBO",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  anon_unknown_0::InvertSSBOInPlaceTest::InvertSSBOInPlaceTest
            (pIVar3,testCtx,&local_78,&local_98,0x100,false,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pIVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pIVar3 = (InvertSSBOInPlaceTest *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ssbo_unsized_arr_multiple_groups",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Read and write same SSBO",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 2;
  local_4c.m_data._0_8_ = &DAT_200000002;
  local_4c.m_data[2] = 4;
  anon_unknown_0::InvertSSBOInPlaceTest::InvertSSBOInPlaceTest
            (pIVar3,testCtx,&local_78,&local_98,0x400,false,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pIVar3);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pWVar4 = (WriteToMultipleSSBOTest *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"write_multiple_arr_single_invocation",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Write to multiple SSBOs",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  anon_unknown_0::WriteToMultipleSSBOTest::WriteToMultipleSSBOTest
            (pWVar4,testCtx,&local_78,&local_98,0x100,true,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pWVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pWVar4 = (WriteToMultipleSSBOTest *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"write_multiple_arr_multiple_groups",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Write to multiple SSBOs",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 2;
  local_4c.m_data._0_8_ = &DAT_200000002;
  local_4c.m_data[2] = 4;
  iVar13 = 1;
  anon_unknown_0::WriteToMultipleSSBOTest::WriteToMultipleSSBOTest
            (pWVar4,testCtx,&local_78,&local_98,0x400,true,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pWVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pWVar4 = (WriteToMultipleSSBOTest *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"write_multiple_unsized_arr_single_invocation",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Write to multiple SSBOs",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  anon_unknown_0::WriteToMultipleSSBOTest::WriteToMultipleSSBOTest
            (pWVar4,testCtx,&local_78,&local_98,0x100,false,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pWVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pWVar4 = (WriteToMultipleSSBOTest *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"write_multiple_unsized_arr_multiple_groups",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Write to multiple SSBOs",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 2;
  local_4c.m_data._0_8_ = &DAT_200000002;
  local_4c.m_data[2] = 4;
  anon_unknown_0::WriteToMultipleSSBOTest::WriteToMultipleSSBOTest
            (pWVar4,testCtx,&local_78,&local_98,0x400,false,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pWVar4);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar5 = (SSBOLocalBarrierTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ssbo_local_barrier_single_invocation",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SSBO local barrier usage",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  anon_unknown_0::SSBOLocalBarrierTest::SSBOLocalBarrierTest
            (pSVar5,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar5);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar5 = (SSBOLocalBarrierTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ssbo_local_barrier_single_group",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SSBO local barrier usage",&local_99);
  local_58.m_data[0] = 3;
  local_58.m_data[1] = 2;
  local_58.m_data[2] = 5;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_4c.m_data[2] = 1;
  anon_unknown_0::SSBOLocalBarrierTest::SSBOLocalBarrierTest
            (pSVar5,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar5);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar5 = (SSBOLocalBarrierTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ssbo_local_barrier_multiple_groups",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SSBO local barrier usage",&local_99);
  local_58.m_data[0] = 3;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 1;
  local_4c.m_data[0] = 2;
  local_4c.m_data[1] = 7;
  local_4c.m_data[2] = 3;
  anon_unknown_0::SSBOLocalBarrierTest::SSBOLocalBarrierTest
            (pSVar5,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar5);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar6 = (SSBOBarrierTest *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ssbo_cmd_barrier_single",(allocator<char> *)&local_4c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SSBO memory barrier usage",&local_9a);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_58.m_data[2] = 1;
  anon_unknown_0::SSBOBarrierTest::SSBOBarrierTest(pSVar6,testCtx,&local_78,&local_98,&local_58);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar6);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar6 = (SSBOBarrierTest *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ssbo_cmd_barrier_multiple",(allocator<char> *)&local_4c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SSBO memory barrier usage",&local_9a);
  local_58.m_data[0] = 0xb;
  local_58.m_data[1] = 5;
  local_58.m_data[2] = 7;
  anon_unknown_0::SSBOBarrierTest::SSBOBarrierTest(pSVar6,testCtx,&local_78,&local_98,&local_58);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar6);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar7 = (SharedVarTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"shared_var_single_invocation",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Basic shared variable usage",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  anon_unknown_0::SharedVarTest::SharedVarTest
            (pSVar7,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar7);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar7 = (SharedVarTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"shared_var_single_group",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Basic shared variable usage",&local_99);
  local_58.m_data[0] = 3;
  local_58.m_data[1] = 2;
  local_58.m_data[2] = 5;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_4c.m_data[2] = 1;
  anon_unknown_0::SharedVarTest::SharedVarTest
            (pSVar7,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar7);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar7 = (SharedVarTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"shared_var_multiple_invocations",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Basic shared variable usage",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_58.m_data[2] = 1;
  local_4c.m_data[0] = 2;
  local_4c.m_data[1] = 5;
  local_4c.m_data[2] = 4;
  anon_unknown_0::SharedVarTest::SharedVarTest
            (pSVar7,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar7);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar7 = (SharedVarTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"shared_var_multiple_groups",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Basic shared variable usage",&local_99);
  local_58.m_data[0] = 3;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 1;
  local_4c.m_data[0] = 2;
  local_4c.m_data[1] = 7;
  local_4c.m_data[2] = 3;
  anon_unknown_0::SharedVarTest::SharedVarTest
            (pSVar7,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar7);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar8 = (SharedVarAtomicOpTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"shared_atomic_op_single_invocation",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Atomic operation with shared var",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_58.m_data[2] = iVar13;
  local_4c.m_data[2] = iVar13;
  anon_unknown_0::SharedVarAtomicOpTest::SharedVarAtomicOpTest
            (pSVar8,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar8 = (SharedVarAtomicOpTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"shared_atomic_op_single_group",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Atomic operation with shared var",&local_99);
  local_58.m_data[0] = 3;
  local_58.m_data[1] = 2;
  local_58.m_data[2] = 5;
  local_4c.m_data[0] = 1;
  local_4c.m_data[1] = 1;
  local_4c.m_data[2] = 1;
  anon_unknown_0::SharedVarAtomicOpTest::SharedVarAtomicOpTest
            (pSVar8,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar8 = (SharedVarAtomicOpTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"shared_atomic_op_multiple_invocations",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Atomic operation with shared var",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_58.m_data[2] = 1;
  local_4c.m_data[0] = 2;
  local_4c.m_data[1] = 5;
  local_4c.m_data[2] = 4;
  anon_unknown_0::SharedVarAtomicOpTest::SharedVarAtomicOpTest
            (pSVar8,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pSVar8 = (SharedVarAtomicOpTest *)operator_new(0x88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"shared_atomic_op_multiple_groups",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Atomic operation with shared var",&local_99);
  local_58.m_data[0] = 3;
  local_58.m_data[1] = 4;
  local_58.m_data[2] = 1;
  local_4c.m_data[0] = 2;
  local_4c.m_data[1] = 7;
  local_4c.m_data[2] = 3;
  anon_unknown_0::SharedVarAtomicOpTest::SharedVarAtomicOpTest
            (pSVar8,testCtx,&local_78,&local_98,&local_58,&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pSVar8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pCVar9 = (CopyImageToSSBOTest *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"copy_image_to_ssbo_small",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Image to SSBO copy",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 0x40;
  local_4c.m_data[1] = 0x40;
  anon_unknown_0::CopyImageToSSBOTest::CopyImageToSSBOTest
            (pCVar9,testCtx,&local_78,&local_98,(IVec2 *)&local_58,(IVec2 *)&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pCVar9);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pCVar9 = (CopyImageToSSBOTest *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"copy_image_to_ssbo_large",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Image to SSBO copy",&local_99);
  local_58.m_data[0] = 2;
  local_58.m_data[1] = 4;
  local_4c.m_data[0] = 0x200;
  local_4c.m_data[1] = 0x200;
  anon_unknown_0::CopyImageToSSBOTest::CopyImageToSSBOTest
            (pCVar9,testCtx,&local_78,&local_98,(IVec2 *)&local_58,(IVec2 *)&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pCVar9);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pCVar10 = (CopySSBOToImageTest *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"copy_ssbo_to_image_small",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SSBO to image copy",&local_99);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  local_4c.m_data[0] = 0x40;
  local_4c.m_data[1] = 0x40;
  anon_unknown_0::CopySSBOToImageTest::CopySSBOToImageTest
            (pCVar10,testCtx,&local_78,&local_98,(IVec2 *)&local_58,(IVec2 *)&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pCVar10);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pCVar10 = (CopySSBOToImageTest *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"copy_ssbo_to_image_large",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SSBO to image copy",&local_99);
  local_58.m_data[0] = 2;
  local_58.m_data[1] = 4;
  local_4c.m_data[0] = 0x200;
  local_4c.m_data[1] = 0x200;
  anon_unknown_0::CopySSBOToImageTest::CopySSBOToImageTest
            (pCVar10,testCtx,&local_78,&local_98,(IVec2 *)&local_58,(IVec2 *)&local_4c);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pCVar10);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pIVar11 = (ImageAtomicOpTest *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"image_atomic_op_local_size_1",(allocator<char> *)&local_4c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Atomic operation with image",&local_9a);
  local_58.m_data[0] = 0x40;
  local_58.m_data[1] = 0x40;
  anon_unknown_0::ImageAtomicOpTest::ImageAtomicOpTest
            (pIVar11,testCtx,&local_78,&local_98,1,(IVec2 *)&local_58);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pIVar11);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pIVar11 = (ImageAtomicOpTest *)operator_new(0x80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"image_atomic_op_local_size_8",(allocator<char> *)&local_4c);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Atomic operation with image",&local_9a);
  local_58.m_data[0] = 0x40;
  local_58.m_data[1] = 0x40;
  anon_unknown_0::ImageAtomicOpTest::ImageAtomicOpTest
            (pIVar11,testCtx,&local_78,&local_98,8,(IVec2 *)&local_58);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pIVar11);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pIVar12 = (ImageBarrierTest *)operator_new(0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"image_barrier_single",(allocator<char> *)&local_4c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Image barrier",&local_9a);
  local_58.m_data[0] = 1;
  local_58.m_data[1] = 1;
  anon_unknown_0::ImageBarrierTest::ImageBarrierTest
            (pIVar12,testCtx,&local_78,&local_98,(IVec2 *)&local_58);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pIVar12);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  pIVar12 = (ImageBarrierTest *)operator_new(0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"image_barrier_multiple",(allocator<char> *)&local_4c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Image barrier",&local_9a);
  local_58.m_data[0] = 0x40;
  local_58.m_data[1] = 0x40;
  anon_unknown_0::ImageBarrierTest::ImageBarrierTest
            (pIVar12,testCtx,&local_78,&local_98,(IVec2 *)&local_58);
  tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)pIVar12);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar1 = basicComputeTests.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr;
  basicComputeTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data.ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&basicComputeTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createBasicComputeShaderTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> basicComputeTests(new tcu::TestCaseGroup(testCtx, "basic", "Basic compute tests"));

	addFunctionCaseWithPrograms(basicComputeTests.get(), "empty_shader", "Shader that does nothing", EmptyShaderTest::createProgram, EmptyShaderTest::createTest);

	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_single_invocation",	"Copy from UBO to SSBO, inverting bits",	256,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_single_group",			"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(2,1,4),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_multiple_invocations",	"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(1,1,1),	tcu::IVec3(2,4,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::UBOToSSBOInvertCase(testCtx,	"ubo_to_ssbo_multiple_groups",		"Copy from UBO to SSBO, inverting bits",	1024,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_single_invocation",		"Copy between SSBOs, inverting bits",	256,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_multiple_invocations",	"Copy between SSBOs, inverting bits",	1024,	tcu::IVec3(1,1,1),	tcu::IVec3(2,4,1)));
	basicComputeTests->addChild(BufferToBufferInvertTest::CopyInvertSSBOCase(testCtx,	"copy_ssbo_multiple_groups",		"Copy between SSBOs, inverting bits",	1024,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_rw_single_invocation",			"Read and write same SSBO",		256,	true,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_rw_multiple_groups",				"Read and write same SSBO",		1024,	true,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_unsized_arr_single_invocation",	"Read and write same SSBO",		256,	false,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new InvertSSBOInPlaceTest(testCtx,	"ssbo_unsized_arr_multiple_groups",		"Read and write same SSBO",		1024,	false,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_arr_single_invocation",			"Write to multiple SSBOs",	256,	true,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_arr_multiple_groups",			"Write to multiple SSBOs",	1024,	true,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_unsized_arr_single_invocation",	"Write to multiple SSBOs",	256,	false,	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new WriteToMultipleSSBOTest(testCtx,	"write_multiple_unsized_arr_multiple_groups",	"Write to multiple SSBOs",	1024,	false,	tcu::IVec3(1,4,2),	tcu::IVec3(2,2,4)));

	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_single_invocation",	"SSBO local barrier usage",	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_single_group",		"SSBO local barrier usage",	tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOLocalBarrierTest(testCtx,	"ssbo_local_barrier_multiple_groups",	"SSBO local barrier usage",	tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new SSBOBarrierTest(testCtx,	"ssbo_cmd_barrier_single",		"SSBO memory barrier usage",	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SSBOBarrierTest(testCtx,	"ssbo_cmd_barrier_multiple",	"SSBO memory barrier usage",	tcu::IVec3(11,5,7)));

	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_single_invocation",		"Basic shared variable usage",	tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_single_group",			"Basic shared variable usage",	tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_multiple_invocations",	"Basic shared variable usage",	tcu::IVec3(1,1,1),	tcu::IVec3(2,5,4)));
	basicComputeTests->addChild(new SharedVarTest(testCtx,	"shared_var_multiple_groups",		"Basic shared variable usage",	tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_single_invocation",		"Atomic operation with shared var",		tcu::IVec3(1,1,1),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_single_group",			"Atomic operation with shared var",		tcu::IVec3(3,2,5),	tcu::IVec3(1,1,1)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_multiple_invocations",	"Atomic operation with shared var",		tcu::IVec3(1,1,1),	tcu::IVec3(2,5,4)));
	basicComputeTests->addChild(new SharedVarAtomicOpTest(testCtx,	"shared_atomic_op_multiple_groups",			"Atomic operation with shared var",		tcu::IVec3(3,4,1),	tcu::IVec3(2,7,3)));

	basicComputeTests->addChild(new CopyImageToSSBOTest(testCtx,	"copy_image_to_ssbo_small",	"Image to SSBO copy",	tcu::IVec2(1,1),	tcu::IVec2(64,64)));
	basicComputeTests->addChild(new CopyImageToSSBOTest(testCtx,	"copy_image_to_ssbo_large",	"Image to SSBO copy",	tcu::IVec2(2,4),	tcu::IVec2(512,512)));

	basicComputeTests->addChild(new CopySSBOToImageTest(testCtx,	"copy_ssbo_to_image_small",	"SSBO to image copy",	tcu::IVec2(1, 1),	tcu::IVec2(64, 64)));
	basicComputeTests->addChild(new CopySSBOToImageTest(testCtx,	"copy_ssbo_to_image_large",	"SSBO to image copy",	tcu::IVec2(2, 4),	tcu::IVec2(512, 512)));

	basicComputeTests->addChild(new ImageAtomicOpTest(testCtx,	"image_atomic_op_local_size_1",	"Atomic operation with image",	1,	tcu::IVec2(64,64)));
	basicComputeTests->addChild(new ImageAtomicOpTest(testCtx,	"image_atomic_op_local_size_8",	"Atomic operation with image",	8,	tcu::IVec2(64,64)));

	basicComputeTests->addChild(new ImageBarrierTest(testCtx,	"image_barrier_single",		"Image barrier",	tcu::IVec2(1,1)));
	basicComputeTests->addChild(new ImageBarrierTest(testCtx,	"image_barrier_multiple",	"Image barrier",	tcu::IVec2(64,64)));

	return basicComputeTests.release();
}